

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O0

void rengine::rengine_fractalTexture(uint *bits,vec2 size)

{
  int iVar1;
  uint *puVar2;
  uint local_94 [3];
  uint local_88;
  uint pb;
  uint local_80;
  uint local_7c;
  uint pg;
  uint local_74;
  uint local_70;
  uint pr;
  uint local_68;
  float local_64;
  uint pa;
  float fv;
  float y;
  float x;
  int i;
  float zy;
  float zx;
  float tx;
  int ix;
  float ty;
  int iy;
  uint stride;
  int h;
  int w;
  int iter;
  float cx;
  float cy;
  uint b;
  uint g;
  uint r;
  uint *bits_local;
  vec2 size_local;
  
  _g = bits;
  bits_local = (uint *)size;
  iVar1 = rand();
  b = iVar1 % 0x100;
  iVar1 = rand();
  cy = (float)(iVar1 % 0x100);
  iVar1 = rand();
  cx = (float)(iVar1 % 0x100);
  iVar1 = rand();
  iter = (int)((float)(iVar1 % 100) / 100.0);
  iVar1 = rand();
  w = (int)((float)(iVar1 % 100) / 100.0);
  h = 0x32;
  ty = (float)(int)bits_local._0_4_;
  iy = (int)bits_local._4_4_;
  ix = 0;
  stride = (uint)ty;
  do {
    if (iy <= ix) {
      return;
    }
    tx = (float)ix / (float)iy;
    for (zx = 0.0; (int)zx < (int)stride; zx = (float)((int)zx + 1)) {
      zy = (float)(int)zx / (float)(int)stride;
      i = (int)((zy - 0.5) * 2.0);
      x = (tx - 0.5) * 3.0;
      for (y = 0.0; (int)y < h; y = (float)((int)y + 1)) {
        fv = (float)i * (float)i + -(x * x) + (float)w;
        pa = (uint)(x * (float)i + (float)i * x + (float)iter);
        if (4.0 < fv * fv + (float)pa * (float)pa) break;
        x = (float)pa;
        i = (int)fv;
      }
      local_64 = (float)(int)y / (float)h;
      if (1.0 <= local_64) {
        local_64 = 0.0;
      }
      local_64 = local_64 * 3.0;
      pr = 0xff;
      local_70 = (uint)(long)(local_64 * 255.0);
      puVar2 = std::min<unsigned_int>(&pr,&local_70);
      local_68 = *puVar2;
      pg = 0xff;
      local_7c = (uint)(long)(local_64 * (float)b);
      puVar2 = std::min<unsigned_int>(&pg,&local_7c);
      local_74 = *puVar2;
      pb = 0xff;
      local_88 = (uint)(long)(local_64 * (float)(uint)cy);
      puVar2 = std::min<unsigned_int>(&pb,&local_88);
      local_80 = *puVar2;
      local_94[1] = 0xff;
      local_94[0] = (uint)(long)(local_64 * (float)(uint)cx);
      puVar2 = std::min<unsigned_int>(local_94 + 1,local_94);
      local_94[2] = *puVar2;
      _g[(uint)((int)zx + ix * (int)ty)] =
           local_68 << 0x18 | local_94[2] << 0x10 | local_80 << 8 | local_74;
    }
    ix = ix + 1;
  } while( true );
}

Assistant:

inline void rengine_fractalTexture(unsigned *bits, vec2 size)
{
    unsigned r = rand() % 256;
    unsigned g = rand() % 256;
    unsigned b = rand() % 256;

    float cy = (rand() % 100) / 100.0;
    float cx = (rand() % 100) / 100.0;
    int iter = 50;

    int w = size.x;
    int h = size.y;
    unsigned stride = w;

    for (int iy=0; iy<h; ++iy) {
        float ty = iy / (float) h;
        for (int ix=0; ix<w; ++ix) {
            float tx = ix / (float) w;

            float zx = 2.0 * (tx - 0.5);
            float zy = 3.0 * (ty - 0.5);
            int i = 0;
            for (i=0; i<iter; ++i) {
                float x = (zx * zx - zy * zy) + cx;
                float y = (zy * zx + zx * zy) + cy;

                if (x*x + y*y > 4.0) break;
                zx = x;
                zy = y;
            }

            float fv = i / float(iter);
            if (fv >= 1.0f)
                fv = 0.0f;
            fv = fv * 3.0f;

            unsigned pa = std::min<unsigned>(255, (fv * 255));
            unsigned pr = std::min<unsigned>(255, (fv * r));
            unsigned pg = std::min<unsigned>(255, (fv * g));
            unsigned pb = std::min<unsigned>(255, (fv * b));
            bits[ix + iy * stride] = (pa << 24) | (pb << 16) | (pg << 8) | (pr);
        }
    }
}